

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall
JetHead::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
push_back(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  uVar3 = this->mSize;
  if (uVar3 == this->mAllocated) {
    sizeup(this,0);
    uVar3 = this->mSize;
  }
  pbVar1 = this->mData;
  pbVar4 = pbVar1 + uVar3;
  (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
  pcVar2 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pbVar1 + uVar3),pcVar2,pcVar2 + val->_M_string_length);
  this->mSize = this->mSize + 1;
  return;
}

Assistant:

void push_back(const T& val)
		{
			// If we've hit our limit, grow the array
			if (mSize == mAllocated)
			{
				sizeup();
			}
 
			// Now that we've got space, placement-new a copy of val
			new(mData + mSize) T(val);

			// And remember that we've stored another object
			mSize++;
		}